

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

DoublePoint ClipperLib::GetUnitNormal(IntPoint *pt1,IntPoint *pt2)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  DoublePoint DVar5;
  
  lVar1 = pt2->X - pt1->X;
  if (lVar1 == 0) {
    dVar3 = 0.0;
    dVar4 = 0.0;
    if (pt2->Y == pt1->Y) goto LAB_006e72ac;
  }
  dVar3 = (double)lVar1;
  dVar4 = (double)(pt2->Y - pt1->Y);
  dVar2 = dVar3 * dVar3 + dVar4 * dVar4;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar4 = dVar4 * (1.0 / dVar2);
  dVar3 = dVar3 * -(1.0 / dVar2);
LAB_006e72ac:
  DVar5.Y = dVar3;
  DVar5.X = dVar4;
  return DVar5;
}

Assistant:

DoublePoint GetUnitNormal( const IntPoint &pt1, const IntPoint &pt2)
{
  if(pt2.X == pt1.X && pt2.Y == pt1.Y) 
    return DoublePoint(0, 0);

  double dx = (double)(pt2.X - pt1.X);
  double dy = (double)(pt2.Y - pt1.Y);
  double f = 1 *1.0/ std::sqrt( dx*dx + dy*dy );
  dx *= f;
  dy *= f;
  return DoublePoint(dy, -dx);
}